

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

void __thiscall MultiAgentDecisionProcess::InitializeUnixName(MultiAgentDecisionProcess *this)

{
  string unixName;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::rfind((char)&this->_m_problemFile,0x2f);
  std::__cxx11::string::substr((ulong)local_58,(ulong)&this->_m_problemFile);
  std::__cxx11::string::rfind((char)local_58,0x2e);
  std::__cxx11::string::substr((ulong)local_38,(ulong)local_58);
  std::__cxx11::string::operator=((string *)&this->_m_unixName,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void MultiAgentDecisionProcess::InitializeUnixName()
{
    // strip everything before and including the last /
    string unixName=_m_problemFile.substr(_m_problemFile.find_last_of('/') + 1);

    // and after the last .
    _m_unixName=unixName.substr(0,unixName.find_last_of('.'));
}